

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec * cram_beta_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  kh_m_i2i_t *pkVar1;
  cram_codec *pcVar2;
  cram_external_type cVar3;
  ulong uVar4;
  uint uVar5;
  code *pcVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar2->codec = E_BETA;
    pcVar2->free = cram_beta_encode_free;
    pcVar6 = cram_beta_encode_char;
    if (option == E_INT) {
      pcVar6 = cram_beta_encode_int;
    }
    pcVar2->encode = pcVar6;
    pcVar2->store = cram_beta_encode_store;
    if (dat == (void *)0x0) {
      uVar5 = 0x80000000;
      uVar4 = 0;
      uVar9 = 0x7fffffff;
      do {
        uVar10 = uVar4 & 0xffffffff;
        if ((int)uVar9 < (int)(uint)uVar4) {
          uVar10 = (ulong)uVar9;
        }
        bVar12 = st->freqs[uVar4] == 0;
        uVar8 = (uint)uVar10;
        if (bVar12) {
          uVar10 = (ulong)uVar9;
          uVar8 = uVar9;
        }
        uVar7 = (ulong)uVar5;
        if (!bVar12) {
          uVar7 = uVar4 & 0xffffffff;
          uVar5 = (uint)uVar4;
        }
        uVar4 = uVar4 + 1;
        uVar9 = uVar8;
      } while (uVar4 != 0x400);
      pkVar1 = st->h;
      if ((pkVar1 != (kh_m_i2i_t *)0x0) && ((ulong)pkVar1->n_buckets != 0)) {
        bVar11 = 0;
        uVar4 = 0;
        do {
          if ((pkVar1->flags[uVar4 >> 4 & 0xfffffff] >> (bVar11 & 0x1e) & 3) == 0) {
            uVar9 = pkVar1->keys[uVar4];
            bVar12 = (int)uVar9 <= (int)uVar8;
            uVar8 = (uint)uVar10;
            if (bVar12) {
              uVar10 = (ulong)uVar9;
              uVar8 = uVar9;
            }
            bVar12 = (int)uVar5 <= (int)uVar9;
            uVar5 = (uint)uVar7;
            if (bVar12) {
              uVar7 = (ulong)uVar9;
              uVar5 = uVar9;
            }
          }
          uVar4 = uVar4 + 1;
          bVar11 = bVar11 + 2;
        } while (pkVar1->n_buckets != uVar4);
      }
    }
    else {
      uVar8 = *dat;
      uVar5 = *(uint *)((long)dat + 4);
    }
    if ((int)uVar5 < (int)uVar8) {
      __assert_fail("max_val >= min_val",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x2a7,
                    "cram_codec *cram_beta_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    (pcVar2->field_6).huffman.ncodes = -uVar8;
    cVar3 = 0;
    uVar5 = uVar5 - uVar8;
    if (uVar5 != 0) {
      do {
        cVar3 = cVar3 + E_INT;
        bVar12 = 1 < uVar5;
        uVar5 = (int)uVar5 >> 1;
      } while (bVar12);
    }
    (pcVar2->field_6).external.type = cVar3;
  }
  return pcVar2;
}

Assistant:

cram_codec *cram_beta_encode_init(cram_stats *st,
				  enum cram_external_type option,
				  void *dat,
				  int version) {
    cram_codec *c;
    int min_val, max_val, len = 0;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec  = E_BETA;
    c->free   = cram_beta_encode_free;
    if (option == E_INT)
	c->encode = cram_beta_encode_int;
    else
	c->encode = cram_beta_encode_char;
    c->store  = cram_beta_encode_store;

    if (dat) {
	min_val = ((int *)dat)[0];
	max_val = ((int *)dat)[1];
    } else {
	min_val = INT_MAX;
	max_val = INT_MIN;
	int i;
	for (i = 0; i < MAX_STAT_VAL; i++) {
	    if (!st->freqs[i])
		continue;
	    if (min_val > i)
		min_val = i;
	    max_val = i;
	}
	if (st->h) {
	    khint_t k;

	    for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
		if (!kh_exist(st->h, k))
		    continue;
	    
		i = kh_key(st->h, k);
		if (min_val > i)
		    min_val = i;
		if (max_val < i)
		    max_val = i;
	    }
	}
    }

    assert(max_val >= min_val);
    c->e_beta.offset = -min_val;
    max_val -= min_val;
    while (max_val) {
	len++;
	max_val >>= 1;
    }
    c->e_beta.nbits = len;

    return c;
}